

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

void Gia_AigerWriteUnsigned(Vec_Str_t *vStr,uint x)

{
  while( true ) {
    if (x < 0x80) break;
    Vec_StrPush(vStr,(byte)x | 0x80);
    x = x >> 7;
  }
  Vec_StrPush(vStr,(byte)x);
  return;
}

Assistant:

static inline void Gia_AigerWriteUnsigned( Vec_Str_t * vStr, unsigned x )
{
    unsigned char ch;
    while (x & ~0x7f)
    {
        ch = (x & 0x7f) | 0x80;
        Vec_StrPush( vStr, ch );
        x >>= 7;
    }
    ch = x;
    Vec_StrPush( vStr, ch );
}